

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall
QMetaCallEvent::QMetaCallEvent
          (QMetaCallEvent *this,QSlotObjectBase *slotO,QObject *sender,int signalId,int nargs)

{
  bool bVar1;
  QObject *in_RDI;
  undefined4 in_R8D;
  pointer in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  QMetaCallEvent *in_stack_ffffffffffffffd0;
  
  QAbstractMetaCallEvent::QAbstractMetaCallEvent
            (&in_stack_ffffffffffffffd0->super_QAbstractMetaCallEvent,in_RDI,
             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(QSemaphore *)in_stack_ffffffffffffffb8
            );
  in_RDI->_vptr_QObject = (_func_int **)&PTR__QMetaCallEvent_00be7348;
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &in_RDI[2].d_ptr,in_stack_ffffffffffffffb8);
  in_RDI[3]._vptr_QObject = (_func_int **)0x0;
  in_RDI[3].d_ptr.d = (QObjectData *)0x0;
  *(undefined4 *)&in_RDI[4]._vptr_QObject = in_R8D;
  *(undefined2 *)((long)&in_RDI[4]._vptr_QObject + 4) = 0;
  *(undefined2 *)((long)&in_RDI[4]._vptr_QObject + 6) = 0xffff;
  memset(&in_RDI[4].d_ptr,0,0x30);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
                     0x3eba38);
  if (bVar1) {
    std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::operator->
              ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
               0x3eba4c);
    QtPrivate::QSlotObjectBase::ref((QSlotObjectBase *)0x3eba54);
  }
  allocArgs(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

QMetaCallEvent::QMetaCallEvent(QtPrivate::QSlotObjectBase *slotO,
                               const QObject *sender, int signalId,
                               int nargs)
    : QAbstractMetaCallEvent(sender, signalId),
      d({QtPrivate::SlotObjUniquePtr(slotO), nullptr, nullptr, nargs, 0, ushort(-1)}),
      prealloc_()
{
    if (d.slotObj_)
        d.slotObj_->ref();
    allocArgs();
}